

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

QRgbaFloat32 *
qt_fetch_linear_gradient_rgbfp
          (QRgbaFloat32 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  bool bVar1;
  QRgbaFloat<float> *b;
  int v;
  QRgbaFloat32 *pQVar2;
  QRgbaFloat32 *pQVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Type TVar11;
  
  dVar6 = (op->field_16).linear.l;
  dVar10 = 0.0;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar7 = data->dx + ((double)y + 0.5) * data->m21 + ((double)x + 0.5) * data->m11;
    dVar8 = data->dy + ((double)y + 0.5) * data->m22 + ((double)x + 0.5) * data->m12;
    dVar6 = (op->field_16).linear.dx;
    dVar10 = (op->field_16).linear.dy;
    if ((data->m13 != 0.0) || (NAN(data->m13))) {
      bVar1 = false;
    }
    else {
      bVar1 = data->m23 == 0.0;
    }
    dVar9 = dVar6 * dVar7 + dVar8 * dVar10 + (op->field_16).linear.off;
    dVar10 = dVar6 * data->m11 + data->m12 * dVar10;
    if (bVar1) {
      dVar9 = dVar9 * 1023.0;
      dVar10 = dVar10 * 1023.0;
    }
  }
  else {
    dVar7 = 0.0;
    dVar8 = 0.0;
    bVar1 = true;
    dVar9 = 0.0;
  }
  pQVar3 = buffer + length;
  if (bVar1) {
    if (1e-05 <= ABS(dVar10)) {
      if (((4194303.0 <= ABS(dVar10)) || (4194303.0 <= ABS(dVar9))) ||
         (4194303.0 <= ABS((double)length * dVar10 + dVar9))) {
        if (0 < length) {
          pQVar2 = buffer;
          do {
            TVar11 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar9 * 0.0009765625);
            pQVar2->r = TVar11.r;
            pQVar2->g = TVar11.g;
            pQVar2->b = TVar11.b;
            pQVar2->a = TVar11.a;
            dVar9 = dVar9 + dVar10;
            pQVar2 = pQVar2 + 1;
          } while (pQVar2 < pQVar3);
        }
      }
      else if (0 < length) {
        v = (int)(dVar9 * 256.0);
        pQVar2 = buffer;
        do {
          TVar11 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,v);
          pQVar2->r = TVar11.r;
          pQVar2->g = TVar11.g;
          pQVar2->b = TVar11.b;
          pQVar2->a = TVar11.a;
          v = v + (int)(dVar10 * 256.0);
          pQVar2 = pQVar2 + 1;
        } while (pQVar2 < pQVar3);
      }
    }
    else {
      if (4194303.0 <= ABS(dVar9)) {
        TVar11 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar9 * 0.0009765625);
        fVar4 = TVar11.r;
        fVar5 = TVar11.g;
      }
      else {
        TVar11 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,(int)(dVar9 * 256.0));
        fVar4 = TVar11.r;
        fVar5 = TVar11.g;
      }
      (*qt_memfill64)((quint64 *)buffer,CONCAT44(fVar5,fVar4),(long)length);
    }
  }
  else if (0 < length) {
    dVar6 = ((double)y + 0.5) * data->m23 + ((double)x + 0.5) * data->m13 + data->m33;
    pQVar2 = buffer;
    do {
      TVar11 = GradientBaseFP::fetchSingle
                         (&(data->field_23).gradient,
                          (dVar7 / dVar6) * (op->field_16).linear.dx +
                          (dVar8 / dVar6) * (op->field_16).linear.dy + (op->field_16).linear.off);
      pQVar2->r = TVar11.r;
      pQVar2->g = TVar11.g;
      pQVar2->b = TVar11.b;
      pQVar2->a = TVar11.a;
      dVar7 = dVar7 + data->m11;
      dVar8 = dVar8 + data->m12;
      dVar6 = dVar6 + data->m13;
      dVar6 = (double)((ulong)dVar6 & -(ulong)(dVar6 != 0.0) |
                      ~-(ulong)(dVar6 != 0.0) & (ulong)(data->m13 + dVar6));
      pQVar2 = pQVar2 + 1;
    } while (pQVar2 < pQVar3);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL qt_fetch_linear_gradient_rgbfp(QRgbaFloat32 *buffer, const Operator *op, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_linear_gradient_template<GradientBaseFP, QRgbaFloat32>(buffer, op, data, y, x, length);
}